

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall Assimp::FBX::MeshGeometry::ReadLayer(MeshGeometry *this,Scope *layer)

{
  bool bVar1;
  reference ppVar2;
  Scope *layerElement;
  Scope *elayer;
  const_iterator eit;
  allocator local_51;
  string local_50;
  ElementCollection local_30;
  ElementCollection *local_20;
  ElementCollection *LayerElement;
  Scope *layer_local;
  MeshGeometry *this_local;
  
  LayerElement = (ElementCollection *)layer;
  layer_local = (Scope *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"LayerElement",&local_51);
  local_30 = Scope::GetCollection(layer,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_20 = &local_30;
  elayer = (Scope *)local_30.first._M_node;
  while( true ) {
    bVar1 = std::operator!=((_Self *)&elayer,&local_20->second);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                          *)&elayer);
    layerElement = GetRequiredScope(ppVar2->second);
    ReadLayerElement(this,layerElement);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                  *)&elayer);
  }
  return;
}

Assistant:

void MeshGeometry::ReadLayer(const Scope& layer)
{
    const ElementCollection& LayerElement = layer.GetCollection("LayerElement");
    for (ElementMap::const_iterator eit = LayerElement.first; eit != LayerElement.second; ++eit) {
        const Scope& elayer = GetRequiredScope(*(*eit).second);

        ReadLayerElement(elayer);
    }
}